

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypePath.h
# Opt level: O0

int __thiscall Js::TypePath::Data::Add<true>(Data *this,PropertyRecord *propId,Type *assignments)

{
  code *pcVar1;
  bool bVar2;
  PropertyId PVar3;
  undefined4 *puVar4;
  PropertyIndex local_26;
  uint local_24;
  PropertyIndex temp;
  Type *pTStack_20;
  uint currentPathLength;
  Type *assignments_local;
  PropertyRecord *propId_local;
  Data *this_local;
  
  local_24 = (uint)this->pathLength;
  pTStack_20 = assignments;
  assignments_local = (Type *)propId;
  propId_local = (PropertyRecord *)this;
  if (this->pathSize <= local_24) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Types/TypePath.h"
                                ,0x9b,"(currentPathLength < this->pathSize)",
                                "currentPathLength < this->pathSize");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (local_24 < this->pathSize) {
    PVar3 = PropertyRecord::GetPropertyId((PropertyRecord *)assignments_local);
    bVar2 = TinyDictionary::TryGetValue<Memory::WriteBarrierPtr<Js::PropertyRecord_const>*>
                      (&this->map,PVar3,&local_26,&stack0xffffffffffffffe0);
    if (bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Types/TypePath.h"
                                  ,0xa7,"(false)","Adding a duplicate to the type path");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    PVar3 = PropertyRecord::GetPropertyId((PropertyRecord *)assignments_local);
    TinyDictionary::Add(&this->map,PVar3,(byte)local_24);
    Memory::WriteBarrierPtr<const_Js::PropertyRecord>::operator=
              (pTStack_20 + local_24,(PropertyRecord *)assignments_local);
    this->pathLength = this->pathLength + '\x01';
    return local_24;
  }
  Throw::InternalError();
}

Assistant:

int Add(const PropertyRecord* propId, Field(const PropertyRecord *)* assignments)
            {
                uint currentPathLength = this->pathLength;
                Assert(currentPathLength < this->pathSize);
                if (currentPathLength >= this->pathSize)
                {
                    Throw::InternalError();
                }

                if (addNewId)
                {
#if DBG
                    PropertyIndex temp;
                    if (this->map.TryGetValue(propId->GetPropertyId(), &temp, assignments))
                    {
                        AssertMsg(false, "Adding a duplicate to the type path");
                    }
#endif
                    this->map.Add((unsigned int)propId->GetPropertyId(), (byte)currentPathLength);
                }
                assignments[currentPathLength] = propId;
                this->pathLength++;
                return currentPathLength;
            }